

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O0

void run_test_evict(VMEMcache *cache,uint n_threads,os_thread_t *threads,uint ops_per_thread,
                   context *ctx,int by_key)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint local_44;
  ulong uStack_40;
  uint i;
  unsigned_long_long n;
  context *pcStack_30;
  int by_key_local;
  context *ctx_local;
  os_thread_t *poStack_20;
  uint ops_per_thread_local;
  os_thread_t *threads_local;
  VMEMcache *pVStack_10;
  uint n_threads_local;
  VMEMcache *cache_local;
  
  n._4_4_ = by_key;
  pcStack_30 = ctx;
  ctx_local._4_4_ = ops_per_thread;
  poStack_20 = threads;
  threads_local._4_4_ = n_threads;
  pVStack_10 = cache;
  free_cache(cache);
  uStack_40 = 0;
  while( true ) {
    if (threads_local._4_4_ <= uStack_40) {
      for (local_44 = 0; local_44 < threads_local._4_4_; local_44 = local_44 + 1) {
        pcStack_30[local_44].worker = worker_thread_test_evict_get;
        pcStack_30[local_44].ops_count = ctx_local._4_4_;
      }
      if (n._4_4_ == 0) {
        pcStack_30[threads_local._4_4_ - 1].worker = worker_thread_test_evict_by_LRU;
      }
      else {
        pcStack_30[threads_local._4_4_ - 1].worker = worker_thread_test_evict_by_key;
      }
      pcVar3 = "_by_LRU";
      if (n._4_4_ != 0) {
        pcVar3 = "_by_key";
      }
      printf("%s%s: STARTED\n","run_test_evict",pcVar3);
      LOCK();
      keep_running = 1;
      UNLOCK();
      run_threads(threads_local._4_4_,poStack_20,pcStack_30);
      free_cache(pVStack_10);
      pcVar3 = "_by_LRU";
      if (n._4_4_ != 0) {
        pcVar3 = "_by_key";
      }
      printf("%s%s: PASSED\n","run_test_evict",pcVar3);
      return;
    }
    iVar1 = vmemcache_put(pcStack_30->cache,&stack0xffffffffffffffc0,8);
    if (iVar1 != 0) break;
    uStack_40 = uStack_40 + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0x1df,"run_test_evict");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_put: %s",uVar2);
  fprintf(_stderr,"\n");
  abort();
}

Assistant:

static void
run_test_evict(VMEMcache *cache, unsigned n_threads, os_thread_t *threads,
		unsigned ops_per_thread, struct context *ctx, int by_key)
{
	free_cache(cache);

	for (unsigned long long n = 0; n < n_threads; ++n) {
		if (vmemcache_put(ctx->cache, &n, sizeof(n), &n, sizeof(n)))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
	}

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].worker = worker_thread_test_evict_get;
		ctx[i].ops_count = ops_per_thread;
	}

	/* overwrite the last routine */
	if (by_key)
		ctx[n_threads - 1].worker = worker_thread_test_evict_by_key;
	else
		ctx[n_threads - 1].worker = worker_thread_test_evict_by_LRU;

	printf("%s%s: STARTED\n", __func__, by_key ? "_by_key" : "_by_LRU");

	__atomic_store_n(&keep_running, 1, __ATOMIC_SEQ_CST);
	run_threads(n_threads, threads, ctx);

	/* success of this function is the main success criteria of this test */
	free_cache(cache);

	printf("%s%s: PASSED\n", __func__, by_key ? "_by_key" : "_by_LRU");
}